

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t read_ahead(archive_read *a,size_t how_many,uint8_t **ptr)

{
  wchar_t wVar1;
  uint8_t *puVar2;
  ssize_t avail;
  ssize_t local_10;
  
  local_10 = -1;
  if (ptr == (uint8_t **)0x0) {
    wVar1 = L'\0';
  }
  else {
    puVar2 = (uint8_t *)__archive_read_ahead(a,how_many,&local_10);
    *ptr = puVar2;
    wVar1 = (wchar_t)(puVar2 != (uint8_t *)0x0);
  }
  return wVar1;
}

Assistant:

static int read_ahead(struct archive_read* a, size_t how_many,
    const uint8_t** ptr)
{
	ssize_t avail = -1;
	if(!ptr)
		return 0;

	*ptr = __archive_read_ahead(a, how_many, &avail);
	if(*ptr == NULL) {
		return 0;
	}

	return 1;
}